

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,char *p,size_t count)

{
  BufHdr *p_00;
  char *__dest;
  EVP_PKEY_CTX *src;
  size_t sVar1;
  Ptr<void> shadow;
  Ptr<void> local_30;
  
  if (count == 0) {
    sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  }
  else {
    shadow.m_p = (void *)0x0;
    shadow.m_refCount = (RefCount *)0x0;
    p_00 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
    if (((p_00 != (BufHdr *)0x0) && (p_00 + 1 <= p)) &&
       (p < (char *)((long)&p_00[1].super_RefCount._vptr_RefCount + p_00->m_bufferSize))) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>(&local_30,p_00);
      rc::Ptr<void>::copy(&shadow,(EVP_PKEY_CTX *)&local_30,src);
      rc::Ptr<void>::~Ptr(&local_30);
    }
    __dest = insertSpace(this,index,count);
    if (__dest == (char *)0x0) {
      sVar1 = 0xffffffffffffffff;
    }
    else {
      if (p != (char *)0x0) {
        memmove(__dest,p,count);
      }
      sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
    }
    rc::Ptr<void>::~Ptr(&shadow);
  }
  return sVar1;
}

Assistant:

size_t
	insert(
		size_t index,
		const T* p,
		size_t count
	) {
		if (count == 0)
			return this->m_count;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		if (p)
			Details::copy(dst, p, count);

		return this->m_count;
	}